

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall
Debugger::CallFunction
          (Debugger *this,char *functionName,JsValueRef *result,JsValueRef arg1,JsValueRef arg2)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  ushort local_ae;
  JsErrorCode jsErrorCode_4;
  unsigned_short argCount;
  JsErrorCode jsErrorCode_3;
  JsValueRef args [3];
  JsValueRef pvStack_80;
  JsErrorCode jsErrorCode_2;
  JsValueRef targetFunc;
  JsPropertyIdRef pvStack_70;
  JsErrorCode jsErrorCode_1;
  JsPropertyIdRef targetFuncId;
  JsErrorCode local_54;
  JsValueRef pvStack_50;
  JsErrorCode jsErrorCode;
  JsValueRef globalObj;
  AutoRestoreContext autoRestoreContext;
  JsValueRef arg2_local;
  JsValueRef arg1_local;
  JsValueRef *result_local;
  char *functionName_local;
  Debugger *this_local;
  
  autoRestoreContext._8_8_ = arg2;
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&globalObj,this->m_context);
  pvStack_50 = (JsValueRef)0x0;
  local_54 = ChakraRTInterface::JsGetGlobalObject(&stack0xffffffffffffffb0);
  if (local_54 == JsNoError) {
    pvStack_70 = (JsPropertyIdRef)0x0;
    targetFunc._4_4_ = CreatePropertyIdFromString(functionName,&stack0xffffffffffffff90);
    if (targetFunc._4_4_ == JsNoError) {
      pvStack_80 = (JsValueRef)0x0;
      JVar1 = ChakraRTInterface::JsGetProperty(pvStack_50,pvStack_70,&stack0xffffffffffffff80);
      if (JVar1 == JsNoError) {
        JVar1 = ChakraRTInterface::JsGetUndefinedValue((JsValueRef *)&stack0xffffffffffffff58);
        if (JVar1 == JsNoError) {
          local_ae = 1;
          if (arg1 != (JsValueRef)0x0) {
            local_ae = 2;
            args[0] = arg1;
          }
          if ((autoRestoreContext._8_8_ != 0) && (local_ae == 1)) {
            pPVar2 = PAL_get_stderr(0);
            PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                        ,0x17a,"arg2 == JS_INVALID_REFERENCE || argCount != 1");
            pPVar2 = PAL_get_stderr(0);
            PAL_fflush(pPVar2);
            DebugBreak();
          }
          if (autoRestoreContext._8_8_ != 0) {
            *(undefined8 *)(&stack0xffffffffffffff58 + (ulong)local_ae * 8) =
                 autoRestoreContext._8_8_;
            local_ae = local_ae + 1;
          }
          JVar1 = ChakraRTInterface::JsCallFunction
                            (pvStack_80,(JsValueRef *)&stack0xffffffffffffff58,local_ae,result);
          if (JVar1 == JsNoError) {
            this_local._7_1_ = true;
          }
          else {
            pPVar2 = PAL_get_stderr(0);
            pWVar3 = Helpers::JsErrorCodeToString(JVar1);
            PAL_fwprintf(pPVar2,
                         L"ERROR: ChakraRTInterface::JsCallFunction(targetFunc, args, argCount, result) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar1,pWVar3);
            pPVar2 = PAL_get_stderr(0);
            PAL_fflush(pPVar2);
            this_local._7_1_ = false;
          }
        }
        else {
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          PAL_fwprintf(pPVar2,
                       L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&args[0]) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar1,pWVar3);
          pPVar2 = PAL_get_stderr(0);
          PAL_fflush(pPVar2);
          this_local._7_1_ = false;
        }
      }
      else {
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        PAL_fwprintf(pPVar2,
                     L"ERROR: ChakraRTInterface::JsGetProperty(globalObj, targetFuncId, &targetFunc) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar1,pWVar3);
        pPVar2 = PAL_get_stderr(0);
        PAL_fflush(pPVar2);
        this_local._7_1_ = false;
      }
    }
    else {
      pPVar2 = PAL_get_stderr(0);
      JVar1 = targetFunc._4_4_;
      pWVar3 = Helpers::JsErrorCodeToString(targetFunc._4_4_);
      PAL_fwprintf(pPVar2,
                   L"ERROR: CreatePropertyIdFromString(functionName, &targetFuncId) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      this_local._7_1_ = false;
    }
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    JVar1 = local_54;
    pWVar3 = Helpers::JsErrorCodeToString(local_54);
    PAL_fwprintf(pPVar2,
                 L"ERROR: ChakraRTInterface::JsGetGlobalObject(&globalObj) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar1,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    this_local._7_1_ = false;
  }
  targetFuncId._0_4_ = 1;
  AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)&globalObj);
  return this_local._7_1_;
}

Assistant:

bool Debugger::CallFunction(char const * functionName, JsValueRef *result, JsValueRef arg1, JsValueRef arg2)
{
    AutoRestoreContext autoRestoreContext(this->m_context);

    // Get the global object
    JsValueRef globalObj = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetGlobalObject(&globalObj));

    // Get a script string for the function name
    JsPropertyIdRef targetFuncId = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(CreatePropertyIdFromString(functionName, &targetFuncId));

    // Get the target function
    JsValueRef targetFunc = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetProperty(globalObj, targetFuncId, &targetFunc));

    static const unsigned short MaxArgs = 2;
    JsValueRef args[MaxArgs + 1];

    // Pass in undefined for 'this'
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetUndefinedValue(&args[0]));

    unsigned short argCount = 1;

    if (arg1 != JS_INVALID_REFERENCE)
    {
        args[argCount++] = arg1;
    }

    Assert(arg2 == JS_INVALID_REFERENCE || argCount != 1);

    if (arg2 != JS_INVALID_REFERENCE)
    {
        args[argCount++] = arg2;
    }

    // Call the function
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCallFunction(targetFunc, args, argCount, result));

    return true;
}